

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_classtrait.cpp
# Opt level: O0

void __thiscall
pfederc::Parser::parseClassTraitBody
          (Parser *this,bool *err,
          list<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
          *functions)

{
  bool bVar1;
  ExprType EVar2;
  Token *pTVar3;
  pointer pFVar4;
  BodyExpr *pBVar5;
  pointer pEVar6;
  pointer local_98;
  bool local_81;
  undefined1 local_78 [24];
  undefined1 local_60 [24];
  undefined1 local_48 [24];
  unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_> local_30;
  unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_> funcExpr;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> expr;
  list<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
  *functions_local;
  bool *err_local;
  Parser *this_local;
  
  do {
    while( true ) {
      pTVar3 = Lexer::getCurrentToken(this->lexer);
      bVar1 = Token::operator!=(pTVar3,TOK_STMT);
      local_81 = false;
      if (bVar1) {
        pTVar3 = Lexer::getCurrentToken(this->lexer);
        local_81 = Token::operator!=(pTVar3,TOK_EOF);
      }
      if (local_81 == false) {
        return;
      }
      pTVar3 = Lexer::getCurrentToken(this->lexer);
      bVar1 = Token::operator==(pTVar3,TOK_EOL);
      if (!bVar1) break;
      Lexer::next(this->lexer);
    }
    parseExpression((Parser *)&funcExpr,(Precedence)this);
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&funcExpr);
    if (bVar1) {
      pEVar6 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator->
                         ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                          &funcExpr);
      EVar2 = Expr::getType(pEVar6);
      if (EVar2 != EXPR_FUNC) goto LAB_00133996;
      pEVar6 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::release
                         ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                          &funcExpr);
      if (pEVar6 == (pointer)0x0) {
        local_98 = (pointer)0x0;
      }
      else {
        local_98 = (pointer)__dynamic_cast(pEVar6,&Expr::typeinfo,&FuncExpr::typeinfo,0);
      }
      std::unique_ptr<pfederc::FuncExpr,std::default_delete<pfederc::FuncExpr>>::
      unique_ptr<std::default_delete<pfederc::FuncExpr>,void>
                ((unique_ptr<pfederc::FuncExpr,std::default_delete<pfederc::FuncExpr>> *)&local_30,
                 local_98);
      pFVar4 = std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>::
               operator->(&local_30);
      pBVar5 = FuncExpr::getBody(pFVar4);
      if (pBVar5 == (BodyExpr *)0x0) {
        local_48._6_2_ = 2;
        local_48._0_4_ = 0x19;
        pFVar4 = std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>::
                 operator->(&local_30);
        Expr::getPosition(&pFVar4->super_Expr);
        std::
        make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                  ((Level *)(local_48 + 8),(SyntaxErrorCode *)(local_48 + 6),(Position *)local_48);
        generateError((Parser *)(local_48 + 0x10),
                      (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                       *)this);
        std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                  ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                   (local_48 + 0x10));
        std::
        unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
        ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                       *)(local_48 + 8));
      }
      std::__cxx11::
      list<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
      ::push_back(functions,&local_30);
      std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>::~unique_ptr
                (&local_30);
    }
    else {
LAB_00133996:
      bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&funcExpr);
      if (bVar1) {
        local_60._6_2_ = 2;
        local_60._0_4_ = 0x16;
        pEVar6 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator->
                           ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                            &funcExpr);
        Expr::getPosition(pEVar6);
        std::
        make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                  ((Level *)(local_60 + 8),(SyntaxErrorCode *)(local_60 + 6),(Position *)local_60);
        generateError((Parser *)(local_60 + 0x10),
                      (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                       *)this);
        std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                  ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                   (local_60 + 0x10));
        std::
        unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
        ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                       *)(local_60 + 8));
      }
    }
    bVar1 = expect(this,TOK_EOL);
    if (!bVar1) {
      local_78._6_2_ = 2;
      local_78._0_4_ = 0xf;
      pTVar3 = Lexer::getCurrentToken(this->lexer);
      Token::getPosition(pTVar3);
      std::
      make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                ((Level *)(local_78 + 8),(SyntaxErrorCode *)(local_78 + 6),(Position *)local_78);
      generateError((Parser *)(local_78 + 0x10),
                    (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)this);
      std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                 (local_78 + 0x10));
      std::
      unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
      ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)(local_78 + 8));
      skipToStmtEol(this);
    }
    std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr
              ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)&funcExpr);
  } while( true );
}

Assistant:

void Parser::parseClassTraitBody(bool &err,
    std::list<std::unique_ptr<FuncExpr>> &functions) noexcept {
  while (*lexer.getCurrentToken() != TokenType::TOK_STMT
      && *lexer.getCurrentToken() != TokenType::TOK_EOF) {
    if (*lexer.getCurrentToken() == TokenType::TOK_EOL) {
      lexer.next();
      continue;
    }

    std::unique_ptr<Expr> expr(parseExpression());
    if (expr && expr->getType() == ExprType::EXPR_FUNC) {
      std::unique_ptr<FuncExpr> funcExpr(
            dynamic_cast<FuncExpr*>(expr.release()));

      /*if (funcExpr->getTemplates()) {
        generateError(std::make_unique<SyntaxError>(LVL_ERROR,
              SyntaxErrorCode::STX_ERR_TRAIT_SCOPE_FUNC_TEMPL,
              std::get<0>(funcExpr->getTemplates()->front())->getPosition()
              + std::get<1>(funcExpr->getTemplates()->back())->getPosition()));
      }*/

      if (!funcExpr->getBody()) {
        generateError(std::make_unique<SyntaxError>(LVL_ERROR,
              SyntaxErrorCode::STX_ERR_TRAITCLASS_SCOPE_FUNC_BODY,
              funcExpr->getPosition()));
      }

      functions.push_back(std::move(funcExpr));
    } else if (expr) {
      generateError(std::make_unique<SyntaxError>(LVL_ERROR, 
            SyntaxErrorCode::STX_ERR_TRAIT_SCOPE, expr->getPosition()));
      // soft error
    }

    if (!expect(TokenType::TOK_EOL)) {
      generateError(std::make_unique<SyntaxError>(LVL_ERROR,
        SyntaxErrorCode::STX_ERR_EXPECTED_EOL, lexer.getCurrentToken()->getPosition()));
      // soft error
      skipToStmtEol();
    }
  }
}